

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

shared_ptr<chaiscript::AST_Node>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,std::shared_ptr<chaiscript::AST_Node>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
          (element_type *param_1,undefined8 param_2,undefined8 *param_3,undefined8 *param_4,
          Type_Conversions_State *param_5)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Result_Type RVar1;
  shared_ptr<chaiscript::AST_Node> sVar2;
  chaiscript acStack_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  RVar1 = boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
                    (acStack_28,(Boxed_Value *)*param_4,param_5);
  (*(code *)*param_3)(param_1,acStack_28,
                      RVar1.
                      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  sVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = param_1;
  return (shared_ptr<chaiscript::AST_Node>)
         sVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }